

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

StructReader * __thiscall
capnp::_::PointerReader::getStruct
          (StructReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  ushort uVar1;
  StructPointerCount SVar2;
  word *pwVar3;
  Arena *pAVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  WirePointer *pWVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  uint uVar14;
  WirePointer *pWVar15;
  WirePointer *pWVar16;
  DebugComparison<int_&,_int> *this_00;
  Exception *local_88;
  Fault f;
  DebugComparison<int_&,_int> _kjCondition;
  int local_4c;
  StructReader *local_48;
  CapTableReader *local_40;
  Fault f_3;
  
  pWVar16 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar16 = this->pointer;
  }
  local_88 = (Exception *)this->segment;
  local_4c = this->nestingLimit;
  pWVar15 = pWVar16 + 1;
  lVar12 = (long)((int)*(uint64_t *)&(pWVar16->offsetAndKind).value >> 2);
  if (local_88 == (Exception *)0x0) {
    pWVar8 = pWVar15 + lVar12;
  }
  else {
    pwVar3 = ((ArrayPtr<const_capnp::word> *)&(local_88->ownFile).content.disposer)->ptr;
    pWVar8 = (WirePointer *)(pwVar3 + (long)local_88->file);
    if (((long)pwVar3 - (long)pWVar15 >> 3 <= lVar12) &&
       (lVar12 <= (long)pWVar8 - (long)pWVar15 >> 3)) {
      pWVar8 = pWVar15 + lVar12;
    }
  }
  local_40 = this->capTable;
  local_48 = __return_storage_ptr__;
  if ((pWVar16->field_1).upper32Bits != 0 || (int)*(uint64_t *)&(pWVar16->offsetAndKind).value != 0)
  goto LAB_0023575a;
  do {
    while( true ) {
      pWVar16 = (WirePointer *)defaultValue;
      if ((pWVar16 == (WirePointer *)0x0) ||
         (iVar7 = (int)*(uint64_t *)&(pWVar16->offsetAndKind).value,
         (pWVar16->field_1).upper32Bits == 0 && iVar7 == 0)) {
        local_48->data = (void *)0x0;
        local_48->pointers = (WirePointer *)0x0;
        local_48->segment = (SegmentReader *)0x0;
        local_48->capTable = (CapTableReader *)0x0;
        *(undefined8 *)((long)&local_48->pointers + 6) = 0;
        local_48->nestingLimit = 0x7fffffff;
        return local_48;
      }
      local_88 = (Exception *)0x0;
      pWVar8 = pWVar16 + (long)(iVar7 >> 2) + 1;
      defaultValue = (word *)0x0;
LAB_0023575a:
      _kjCondition.left = &local_4c;
      _kjCondition._8_8_ = (ulong)(uint)_kjCondition._12_4_ << 0x20;
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = 0 < local_4c;
      if (0 < local_4c) break;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x88b,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,&_kjCondition,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      kj::_::Debug::Fault::~Fault(&f);
    }
    pWVar15 = pWVar16;
    if ((local_88 != (Exception *)0x0) && ((*(uint64_t *)&(pWVar16->offsetAndKind).value & 3) == 2))
    {
      pAVar4 = (Arena *)(local_88->ownFile).content.ptr;
      iVar7 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(pWVar16->field_1).upper32Bits);
      local_88 = (Exception *)CONCAT44(extraout_var,iVar7);
      _kjCondition.right = 0;
      _kjCondition._12_4_ = 0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = local_88 != (Exception *)0x0;
      if (_kjCondition.result) {
        uVar14 = (uint)*(uint64_t *)&(pWVar16->offsetAndKind).value;
        pcVar9 = (char *)(ulong)(uVar14 >> 3);
        pcVar11 = local_88->file;
        if ((long)pcVar11 < (long)pcVar9) {
          pcVar9 = pcVar11;
        }
        pWVar15 = (WirePointer *)
                  (((ArrayPtr<const_capnp::word> *)&(local_88->ownFile).content.disposer)->ptr +
                  (long)pcVar9);
        if (local_88 == (Exception *)0x0) {
          f.exception._0_1_ = 1;
          _kjCondition.left = (int *)&local_88;
LAB_00235ad3:
          if ((*(uint64_t *)&(pWVar16->offsetAndKind).value & 4) == 0) {
            pWVar16 = pWVar15 + 1;
            lVar12 = (long)((int)*(uint64_t *)&(pWVar15->offsetAndKind).value >> 2);
            if (local_88 == (Exception *)0x0) {
              pWVar8 = pWVar16 + lVar12;
            }
            else {
              pwVar3 = ((ArrayPtr<const_capnp::word> *)&(local_88->ownFile).content.disposer)->ptr;
              pWVar8 = (WirePointer *)(pwVar3 + (long)local_88->file);
              if (((long)pwVar3 - (long)pWVar16 >> 3 <= lVar12) &&
                 (lVar12 <= (long)pWVar8 - (long)pWVar16 >> 3)) {
                pWVar8 = pWVar16 + lVar12;
              }
            }
            goto LAB_00235896;
          }
          pWVar16 = pWVar15 + 1;
          pAVar4 = (Arena *)(local_88->ownFile).content.ptr;
          iVar7 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(pWVar15->field_1).upper32Bits);
          f.exception = (Exception *)CONCAT44(extraout_var_00,iVar7);
          _kjCondition.left = (int *)&f;
          _kjCondition.right = 0;
          _kjCondition._12_4_ = 0;
          _kjCondition.op.content.ptr = " != ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = f.exception != (Exception *)0x0;
          if (f.exception == (Exception *)0x0) {
            this_00 = (DebugComparison<int_&,_int> *)&f_3;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x25f,FAILED,"newSegment != nullptr",
                       "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                       (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                       (char (*) [56])"Message contains double-far pointer to unknown segment.");
          }
          else {
            uVar14 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value & 3;
            _kjCondition.left = (int *)CONCAT44(2,uVar14);
            _kjCondition._8_8_ = anon_var_dwarf_a9f8;
            _kjCondition.op.content.ptr = &DAT_00000005;
            _kjCondition.op.content.size_ = (size_t)(uVar14 == 2);
            if (uVar14 == 2) {
              pcVar11 = (char *)(ulong)((uint)*(uint64_t *)&(pWVar15->offsetAndKind).value >> 3);
              if ((long)(f.exception)->file < (long)pcVar11) {
                pcVar11 = (f.exception)->file;
              }
              pWVar8 = (WirePointer *)
                       (((ArrayPtr<const_capnp::word> *)&((f.exception)->ownFile).content.disposer)
                        ->ptr + (long)pcVar11);
              pWVar15 = pWVar16;
              local_88 = f.exception;
              goto LAB_00235896;
            }
            this_00 = (DebugComparison<int_&,_int> *)&f_3;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                       "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                       (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                       &_kjCondition,
                       (char (*) [51])"Second word of double-far pad must be far pointer.");
          }
        }
        else {
          uVar10 = 2 - (ulong)((uVar14 & 4) == 0);
          if (pcVar11 < pcVar9 + uVar10) {
            f.exception = (Exception *)((ulong)f.exception._1_7_ << 8);
            _kjCondition.left = (int *)&local_88;
          }
          else {
            uVar5 = (*(ReadLimiter **)&local_88->line)->limit;
            if (uVar5 < uVar10) {
              _kjCondition.left = (int *)&local_88;
              (*((Arena *)(local_88->ownFile).content.ptr)->_vptr_Arena[3])();
            }
            else {
              (*(ReadLimiter **)&local_88->line)->limit = uVar5 - uVar10;
              _kjCondition.left = (int *)&local_88;
            }
            f.exception._0_1_ = uVar10 <= uVar5;
            if (uVar10 <= uVar5) goto LAB_00235ad3;
          }
          this_00 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                    ((Fault *)this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                     "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [318])
                     "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
        }
        kj::_::Debug::Fault::~Fault((Fault *)this_00);
        pWVar8 = (WirePointer *)0x0;
        pWVar15 = pWVar16;
      }
      else {
        _kjCondition.left = (int *)&local_88;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                   (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                   (char (*) [49])"Message contains far pointer to unknown segment.");
        kj::_::Debug::Fault::~Fault(&f);
        pWVar8 = (WirePointer *)0x0;
      }
    }
LAB_00235896:
    cVar6 = (pWVar8 == (WirePointer *)0x0) * '\x02';
    if (pWVar8 != (WirePointer *)0x0) {
      uVar14 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value & 3;
      _kjCondition.left = (int *)(ulong)uVar14;
      _kjCondition._8_8_ = anon_var_dwarf_a9f8;
      _kjCondition.op.content.ptr = &DAT_00000005;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar14 == 0);
      if (uVar14 == 0) {
        bVar13 = true;
        if (local_88 != (Exception *)0x0) {
          uVar10 = (ulong)(pWVar15->field_1).structRef.dataSize.value +
                   (ulong)(pWVar15->field_1).structRef.ptrCount.value;
          bVar13 = false;
          if ((char *)(((long)pWVar8 -
                        (long)((ArrayPtr<const_capnp::word> *)&(local_88->ownFile).content.disposer)
                              ->ptr >> 3) + uVar10) <= local_88->file) {
            uVar5 = (*(ReadLimiter **)&local_88->line)->limit;
            bVar13 = uVar5 >= uVar10;
            if (uVar5 < uVar10) {
              (*((Arena *)(local_88->ownFile).content.ptr)->_vptr_Arena[3])();
            }
            else {
              (*(ReadLimiter **)&local_88->line)->limit = uVar5 - uVar10;
            }
          }
        }
        f.exception._0_1_ = bVar13;
        if (bVar13 == false) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x89e,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                     "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [322])
                     "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          cVar6 = '\x02';
        }
        else {
          uVar1 = *(ushort *)&pWVar15->field_1;
          SVar2 = (pWVar15->field_1).structRef.ptrCount.value;
          local_48->segment = (SegmentReader *)local_88;
          local_48->capTable = local_40;
          local_48->data = pWVar8;
          local_48->pointers = pWVar8 + uVar1;
          local_48->dataSize = (uint)uVar1 << 6;
          local_48->pointerCount = SVar2;
          local_48->nestingLimit = local_4c + -1;
          cVar6 = '\x01';
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[87]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x898,FAILED,"ref->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer\" \"was expected.\""
                   ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                    &_kjCondition,
                   (char (*) [87])
                   "Schema mismatch: Message contains non-struct pointer where struct pointerwas expected."
                  );
        kj::_::Debug::Fault::~Fault(&f);
        cVar6 = '\x02';
      }
    }
    if (cVar6 != '\x02') {
      return local_48;
    }
  } while( true );
}

Assistant:

StructReader PointerReader::getStruct(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readStructPointer(segment, capTable, ref, defaultValue, nestingLimit);
}